

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918Base.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)4>::do_external_slot
          (Base<(TI::TMS::Personality)4> *this,int access_column)

{
  pointer *ppCVar1;
  byte bVar2;
  ushort uVar3;
  MemoryAccess MVar4;
  int iVar5;
  int iVar6;
  iterator __position;
  pointer pCVar7;
  
  MVar4 = this->queued_access_;
  if ((MVar4 != None) && (this->minimum_access_column_ <= access_column)) {
    uVar3 = this->ram_pointer_;
    this->ram_pointer_ = uVar3 + 1;
    if (MVar4 == Read) {
      this->read_ahead_buffer_ = (this->ram_)._M_elems[uVar3 & 0x3fff];
    }
    else if (MVar4 == Write) {
      bVar2 = this->read_ahead_buffer_;
      if ((this->super_Storage<(TI::TMS::Personality)4,_void>).cram_is_selected_ == true) {
        (this->super_Storage<(TI::TMS::Personality)4,_void>).colour_ram_[uVar3 & 0x1f] =
             (uint)CONCAT12((&DAT_0046aa08)[bVar2 >> 4 & 3],
                            CONCAT11((&DAT_0046aa04)[bVar2 >> 2 & 3],(&DAT_0046aa04)[bVar2 & 3]));
        __position._M_current =
             (this->super_Storage<(TI::TMS::Personality)4,_void>).upcoming_cram_dots_.
             super__Vector_base<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot,_std::allocator<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->super_Storage<(TI::TMS::Personality)4,_void>).upcoming_cram_dots_.
            super__Vector_base<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot,_std::allocator<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot,_std::allocator<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot>_>
          ::_M_realloc_insert<>
                    ((vector<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot,_std::allocator<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot>_>
                      *)this,__position);
        }
        else {
          (__position._M_current)->value = 0;
          ((__position._M_current)->location).row = 0;
          ((__position._M_current)->location).column = 0;
          ppCVar1 = &(this->super_Storage<(TI::TMS::Personality)4,_void>).upcoming_cram_dots_.
                     super__Vector_base<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot,_std::allocator<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        pCVar7 = (this->super_Storage<(TI::TMS::Personality)4,_void>).upcoming_cram_dots_.
                 super__Vector_base<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot,_std::allocator<TI::TMS::Storage<(TI::TMS::Personality)4,_void>::CRAMDot>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar5 = (this->fetch_pointer_).column;
        pCVar7[-1].location.column = iVar5 + -0xb;
        iVar6 = (this->fetch_pointer_).row;
        pCVar7[-1].location.row = iVar6;
        if (iVar5 < 0xb) {
          pCVar7[-1].location.row = iVar6 + -1;
          pCVar7[-1].location.column = iVar5 + 0x14b;
        }
        iVar5 = pCVar7[-1].location.column;
        pCVar7[-1].location.row = pCVar7[-1].location.row + iVar5 / 0x156;
        pCVar7[-1].location.column = iVar5 % 0x156;
        pCVar7[-1].value =
             (this->super_Storage<(TI::TMS::Personality)4,_void>).colour_ram_[uVar3 & 0x1f];
      }
      else {
        (this->ram_)._M_elems[uVar3 & 0x3fff] = bVar2;
      }
    }
    this->queued_access_ = None;
  }
  return;
}

Assistant:

void do_external_slot(int access_column) {
		// Don't do anything if the required time for the access to become executable
		// has yet to pass.
		if(queued_access_ == MemoryAccess::None || access_column < minimum_access_column_) {
			if constexpr (is_yamaha_vdp(personality)) {
				using CommandStep = typename Storage<personality>::CommandStep;

				if(
					Storage<personality>::next_command_step_ == CommandStep::None ||
					access_column < Storage<personality>::minimum_command_column_
				) {
					return;
				}

				auto &context = Storage<personality>::command_context_;
				const uint8_t *const source = (context.arguments & 0x10) ? Storage<personality>::expansion_ram_.data() : ram_.data();
				const AddressT source_mask = (context.arguments & 0x10) ? 0xfff : 0x1ffff;
				uint8_t *const destination = (context.arguments & 0x20) ? Storage<personality>::expansion_ram_.data() : ram_.data();
				const AddressT destination_mask = (context.arguments & 0x20) ? 0xfff : 0x1ffff;
				switch(Storage<personality>::next_command_step_) {
					// Duplicative, but keeps the compiler happy.
					case CommandStep::None:
					break;

					case CommandStep::CopySourcePixelToStatus:
						Storage<personality>::colour_status_ =
							extract_colour(
								source[command_address(context.source, context.arguments & 0x10) & source_mask],
								context.source
							);

						Storage<personality>::command_->advance();
						Storage<personality>::update_command_step(access_column);
					break;

					case CommandStep::ReadSourcePixel:
						context.latched_colour.set(
							extract_colour(
								source[command_address(context.source, context.arguments & 0x10)] & source_mask,
								context.source)
							);

						Storage<personality>::minimum_command_column_ = access_column + 32;
						Storage<personality>::next_command_step_ = CommandStep::ReadDestinationPixel;
					break;

					case CommandStep::ReadDestinationPixel:
						Storage<personality>::command_latch_ =
							source[command_address(context.destination, context.arguments & 0x20) & source_mask];

						Storage<personality>::minimum_command_column_ = access_column + 24;
						Storage<personality>::next_command_step_ = CommandStep::WritePixel;
					break;

					case CommandStep::WritePixel: {
						const auto [mask, unmasked_colour] = command_colour_mask(context.destination);
						const auto address = command_address(context.destination, context.arguments & 0x20) & destination_mask;
						const uint8_t colour = unmasked_colour & mask;
						context.latched_colour.reset();

						using LogicalOperation = CommandContext::LogicalOperation;
						if(!context.test_source || colour) {
							switch(context.pixel_operation) {
								default:
								case LogicalOperation::Copy:
									Storage<personality>::command_latch_ &= ~mask;
									Storage<personality>::command_latch_ |= colour;
								break;
								case LogicalOperation::And:
									Storage<personality>::command_latch_ &= ~mask | colour;
								break;
								case LogicalOperation::Or:
									Storage<personality>::command_latch_ |= colour;
								break;
								case LogicalOperation::Xor:
									Storage<personality>::command_latch_ ^= colour;
								break;
								case LogicalOperation::Not:
									Storage<personality>::command_latch_ &= ~mask;
									Storage<personality>::command_latch_ |= colour ^ mask;
								break;
							}
						}

						destination[address] = Storage<personality>::command_latch_;

						Storage<personality>::command_->advance();
						Storage<personality>::update_command_step(access_column);
					} break;

					case CommandStep::ReadSourceByte: {
						Vector source_vector = context.source;
						if(Storage<personality>::command_->y_only) {
							source_vector.v[0] = context.destination.v[0];
						}
						context.latched_colour.set(source[command_address(source_vector, context.arguments & 0x10) & source_mask]);

						Storage<personality>::minimum_command_column_ = access_column + 24;
						Storage<personality>::next_command_step_ = CommandStep::WriteByte;
					} break;

					case CommandStep::WriteByte:
						destination[command_address(context.destination, context.arguments & 0x20) & destination_mask]
							= context.latched_colour.has_value() ? context.latched_colour.colour : context.colour.colour;
						context.latched_colour.reset();

						Storage<personality>::command_->advance();
						Storage<personality>::update_command_step(access_column);
					break;
				}
			}

			return;
		}

		// Copy and mutate the RAM pointer.
		AddressT address = ram_pointer_;
		++ram_pointer_;

		// Determine the relevant RAM and its mask.
		uint8_t *ram = ram_.data();
		AddressT mask = memory_mask(personality);

		if constexpr (is_yamaha_vdp(personality)) {
			// The Yamaha increments only 14 bits of the address in TMS-compatible modes.
			if(this->underlying_mode_ < ScreenMode::YamahaText80) {
				ram_pointer_ = (ram_pointer_ & 0x3fff) | (address & AddressT(~0x3fff));
			}

			if(this->underlying_mode_ == ScreenMode::YamahaGraphics6 || this->underlying_mode_ == ScreenMode::YamahaGraphics7) {
				// Rotate address one to the right as the hardware accesses
				// the underlying banks of memory alternately but presents
				// them as if linear.
				address = rotate(address);
			}

			// Also check whether expansion RAM is the true target here.
			if(Storage<personality>::command_context_.arguments & 0x40) {
				ram = Storage<personality>::expansion_ram_.data();
				mask = AddressT(Storage<personality>::expansion_ram_.size() - 1);
			}
		}

		switch(queued_access_) {
			default: break;

			case MemoryAccess::Write:
				if constexpr (is_sega_vdp(personality)) {
					if(Storage<personality>::cram_is_selected_) {
						// Adjust the palette. In a Master System blue has a slightly different
						// scale; cf. https://www.retrorgb.com/sega-master-system-non-linear-blue-channel-findings.html
						constexpr uint8_t rg_scale[] = {0, 85, 170, 255};
						constexpr uint8_t b_scale[] = {0, 104, 170, 255};
						Storage<personality>::colour_ram_[address & 0x1f] = palette_pack(
							rg_scale[(read_ahead_buffer_ >> 0) & 3],
							rg_scale[(read_ahead_buffer_ >> 2) & 3],
							b_scale[(read_ahead_buffer_ >> 4) & 3]
						);

						// Schedule a CRAM dot; this is scheduled for wherever it should appear
						// on screen. So it's wherever the output stream would be now. Which
						// is output_lag cycles ago from the point of view of the input stream.
						auto &dot = Storage<personality>::upcoming_cram_dots_.emplace_back();
						dot.location.column = fetch_pointer_.column - output_lag;
						dot.location.row = fetch_pointer_.row;

						// Handle before this row conditionally; then handle after (or, more realistically,
						// exactly at the end of) naturally.
						if(dot.location.column < 0) {
							--dot.location.row;
							dot.location.column += 342;
						}
						dot.location.row += dot.location.column / 342;
						dot.location.column %= 342;

						dot.value = Storage<personality>::colour_ram_[address & 0x1f];
						break;
					}
				}
				ram[address & mask] = read_ahead_buffer_;
			break;
			case MemoryAccess::Read:
				read_ahead_buffer_ = ram[address & mask];
			break;
		}
		queued_access_ = MemoryAccess::None;
	}